

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall Lodtalk::GarbageCollector::internalPerformCollection(GarbageCollector *this)

{
  StackMemories *this_00;
  vector<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_> local_28;
  GarbageCollector *local_10;
  GarbageCollector *this_local;
  
  if (this->disableCount < 1) {
    local_10 = this;
    this_00 = MemoryManager::getStackMemories(this->memoryManager);
    StackMemories::getAll(&local_28,this_00);
    std::vector<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>::operator=
              (&this->currentStacks,&local_28);
    std::vector<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>::~vector(&local_28)
    ;
    mark(this);
    compact(this);
  }
  return;
}

Assistant:

void GarbageCollector::internalPerformCollection()
{
    if(disableCount > 0)
        return;

	// Get the current stacks
	currentStacks = memoryManager->getStackMemories()->getAll();

	// TODO: Suspend the other GC threads.
	mark();
	compact();
}